

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

adh_node_t * adh_search_leaf_by_encoding(bit_array_t *bit_array)

{
  uint local_24;
  adh_node *paStack_20;
  int i;
  adh_node_t *nextNode;
  bit_array_t *bit_array_local;
  
  paStack_20 = adh_root_node;
  local_24 = (uint)bit_array->length;
  while (local_24 = local_24 - 1, -1 < (int)local_24 && paStack_20 != (adh_node_t *)0x0) {
    if (bit_array->buffer[(int)local_24] == '1') {
      paStack_20 = paStack_20->right;
    }
    else {
      paStack_20 = paStack_20->left;
    }
  }
  if (((paStack_20 == (adh_node_t *)0x0) || (paStack_20->right != (adh_node *)0x0)) ||
     (paStack_20->left != (adh_node *)0x0)) {
    bit_array_local = (bit_array_t *)0x0;
  }
  else {
    bit_array_local = (bit_array_t *)paStack_20;
  }
  return (adh_node_t *)bit_array_local;
}

Assistant:

adh_node_t* adh_search_leaf_by_encoding(const bit_array_t *bit_array) {
    adh_node_t* nextNode = adh_root_node;
    for(int i = bit_array->length-1; i >= 0 && nextNode; i--) {
        if(bit_array->buffer[i] == BIT_1) {
            nextNode = nextNode->right;
        } else
            nextNode = nextNode->left;
    }

    // if it's a leaf return it
    if(nextNode && nextNode->right == NULL && nextNode->left == NULL)
        return nextNode;

    return NULL;
}